

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

bool __thiscall Analyser::isConstant(Analyser *this,string *var)

{
  optional<int> oVar1;
  mapped_type *pmVar2;
  long lVar3;
  
  oVar1 = getIndexInLocal(this,var);
  lVar3 = 0xb8;
  if (((ulong)oVar1.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
    oVar1 = getIndexInGlobal(this,var);
    lVar3 = 0xf0;
    if (((ulong)oVar1.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> & 0x100000000) == 0) {
      return false;
    }
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
                         *)((long)&(this->_consts).
                                   super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar3),var);
  return pmVar2->first;
}

Assistant:

bool Analyser::isConstant(const std::string& var)
{
	std::optional<std::int32_t> index = getIndexInLocal(var);
	if (index.has_value()) {
		if (_localVars[var].first) {
			return true;
		}
		return false;
	}
	index = getIndexInGlobal(var);
	if (index.has_value()) {
		if (_globalVars[var].first) {
			return true;
		}
		return false;
	}
	return false;
}